

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

void AddVarArrayField(FMFieldList *FieldP,int *CountP,char *Name,int Type,int ElementSize,
                     char *SizeField)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char *__s_00;
  
  __s = TranslateADIOS2Type2FFS(Type);
  sVar1 = strlen(__s);
  sVar2 = strlen(SizeField);
  sVar1 = sVar1 + sVar2 + 8;
  __s_00 = (char *)malloc(sVar1);
  snprintf(__s_00,sVar1,"%s[%s]",__s,SizeField);
  free(__s);
  AddSimpleField(FieldP,CountP,Name,__s_00,8);
  free(__s_00);
  (*FieldP)[(long)*CountP + -1].field_size = ElementSize;
  return;
}

Assistant:

static void AddVarArrayField(FMFieldList *FieldP, int *CountP, const char *Name, const int Type,
                             int ElementSize, char *SizeField)
{
    char *TransType = TranslateADIOS2Type2FFS(Type);
    char *TypeWithArray = malloc(strlen(TransType) + strlen(SizeField) + 8);
    snprintf(TypeWithArray, strlen(TransType) + strlen(SizeField) + 8, "%s[%s]", TransType,
             SizeField);
    free(TransType);
    AddSimpleField(FieldP, CountP, Name, TypeWithArray, sizeof(void *));
    free(TypeWithArray);
    (*FieldP)[*CountP - 1].field_size = ElementSize;
}